

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

int __thiscall
boost::runtime::enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0>::
clone(enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0> *this,
     __fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0> *p;
  int iVar1;
  shared_ptr<boost::runtime::basic_param> *in_stack_ffffffffffffffe0;
  
  p = (enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0> *)
      operator_new(0x138);
  enum_parameter((enum_parameter<boost::unit_test::output_format,_(boost::runtime::args_amount)0> *)
                 __fn,this);
  iVar1 = (int)this;
  shared_ptr<boost::runtime::basic_param>::
  shared_ptr<boost::runtime::enum_parameter<boost::unit_test::output_format,(boost::runtime::args_amount)0>>
            (in_stack_ffffffffffffffe0,p);
  return iVar1;
}

Assistant:

virtual basic_param_ptr clone() const
    {
        return basic_param_ptr( new enum_parameter( *this ) );
    }